

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O2

void __thiscall AllFloatsParseTest::RunShard(AllFloatsParseTest *this,int shard)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  char *message;
  ulong uVar5;
  float local_c4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  uint32_t me;
  char buffer [100];
  
  uVar4 = CONCAT44(in_register_00000034,shard);
  uVar5 = 0xffffffffffffffff;
  fVar3 = 0.0;
  do {
    local_c4 = (float)uVar4;
    if ((uint)local_c4 < (uint)fVar3) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
    if ((shard == 0) && (uVar2 = uVar4 >> 0x18 & 0xff, (int)uVar2 != (int)uVar5)) {
      printf("value: 0x%08x (%d%%)\r",uVar4,
             (ulong)(uint)(int)(((double)(uVar4 & 0xffffffff) * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar4 = (ulong)(uint)local_c4;
      uVar5 = uVar2;
    }
    fVar3 = (float)uVar4;
    if ((~(uint)fVar3 & 0x7f800000) != 0) {
      iVar1 = snprintf(buffer,100,"%a",(double)fVar3);
      local_c0.ptr_._0_4_ = 0;
      local_a8.data_._0_4_ = wabt::ParseFloat(Hexfloat,buffer,buffer + iVar1,&me);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                ((internal *)&gtest_ar,"Result::Ok",
                 "ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me)",(Enum *)&local_c0,
                 (Result *)&local_a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar1 = 0x6e;
LAB_00125c4f:
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,iVar1,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_c0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"me","bits",&me,(uint *)&local_c4);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_c0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar1 = 0x6f;
        goto LAB_00125c4f;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      fVar3 = local_c4;
    }
    uVar4 = (ulong)(uint)((this->super_ThreadedTest).num_threads_ + (int)fVar3);
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      float value = bit_cast<float>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint32_t me;
      ASSERT_EQ(Result::Ok,
                ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }